

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nested_loop_join_inner.cpp
# Opt level: O3

idx_t duckdb::InitialNestedLoopJoin::Operation<duckdb::interval_t,duckdb::NotEquals>
                (Vector *left,Vector *right,idx_t left_size,idx_t right_size,idx_t *lpos,idx_t *rpos
                ,SelectionVector *lvector,SelectionVector *rvector,idx_t current_match_count)

{
  int iVar1;
  sel_t *psVar2;
  sel_t *psVar3;
  sel_t *psVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  int iVar9;
  long lVar10;
  ulong uVar11;
  idx_t iVar12;
  int *piVar13;
  ulong uVar14;
  bool bVar15;
  bool bVar16;
  UnifiedVectorFormat right_data;
  UnifiedVectorFormat left_data;
  UnifiedVectorFormat local_c0;
  UnifiedVectorFormat local_78;
  
  UnifiedVectorFormat::UnifiedVectorFormat(&local_78);
  UnifiedVectorFormat::UnifiedVectorFormat(&local_c0);
  Vector::ToUnifiedFormat(left,left_size,&local_78);
  Vector::ToUnifiedFormat(right,right_size,&local_c0);
  uVar14 = *rpos;
  if (uVar14 < right_size) {
    psVar2 = (local_c0.sel)->sel_vector;
    iVar12 = 0;
    do {
      if (psVar2 != (sel_t *)0x0) {
        uVar14 = (ulong)psVar2[uVar14];
      }
      if (local_c0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
          (unsigned_long *)0x0) {
        bVar15 = false;
      }
      else {
        bVar15 = (local_c0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                  [uVar14 >> 6] >> (uVar14 & 0x3f) & 1) == 0;
      }
      uVar11 = *lpos;
      if (uVar11 < left_size) {
        piVar13 = (int *)(local_c0.data + uVar14 * 0x10);
        psVar3 = lvector->sel_vector;
        psVar4 = rvector->sel_vector;
        do {
          if (iVar12 == 0x800) {
            iVar12 = 0x800;
            goto LAB_00ce9182;
          }
          uVar14 = uVar11;
          if ((local_78.sel)->sel_vector != (sel_t *)0x0) {
            uVar14 = (ulong)(local_78.sel)->sel_vector[uVar11];
          }
          if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
              (unsigned_long *)0x0) {
            bVar16 = false;
          }
          else {
            bVar16 = (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                      [uVar14 >> 6] >> (uVar14 & 0x3f) & 1) == 0;
          }
          if (!bVar16 && !bVar15) {
            lVar7 = uVar14 * 0x10;
            iVar1 = *(int *)(local_78.data + lVar7 + 4);
            iVar9 = piVar13[1];
            lVar5 = *(long *)(local_78.data + lVar7 + 8);
            lVar6 = *(long *)(piVar13 + 2);
            if (((*(int *)(local_78.data + lVar7) != *piVar13) || (iVar1 != iVar9)) ||
               (iVar9 = iVar1, lVar5 != lVar6)) {
              lVar8 = (long)iVar1 + lVar5 / 86400000000;
              lVar10 = (long)iVar9 + lVar6 / 86400000000;
              if ((((long)*(int *)(local_78.data + lVar7) + lVar8 / 0x1e !=
                    (long)*piVar13 + lVar10 / 0x1e) || (lVar8 % 0x1e != lVar10 % 0x1e)) ||
                 (lVar5 % 86400000000 != lVar6 % 86400000000)) {
                psVar3[iVar12] = (sel_t)uVar11;
                psVar4[iVar12] = (sel_t)*rpos;
                iVar12 = iVar12 + 1;
              }
            }
          }
          uVar11 = uVar11 + 1;
          *lpos = uVar11;
        } while (left_size != uVar11);
      }
      *lpos = 0;
      uVar14 = *rpos + 1;
      *rpos = uVar14;
    } while (uVar14 < right_size);
  }
  else {
    iVar12 = 0;
  }
LAB_00ce9182:
  if (local_c0.owned_sel.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_c0.owned_sel.selection_data.internal.
               super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_c0.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_c0.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_78.owned_sel.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_78.owned_sel.selection_data.internal.
               super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  return iVar12;
}

Assistant:

static idx_t Operation(Vector &left, Vector &right, idx_t left_size, idx_t right_size, idx_t &lpos, idx_t &rpos,
	                       SelectionVector &lvector, SelectionVector &rvector, idx_t current_match_count) {
		using MATCH_OP = ComparisonOperationWrapper<OP>;

		// initialize phase of nested loop join
		// fill lvector and rvector with matches from the base vectors
		UnifiedVectorFormat left_data, right_data;
		left.ToUnifiedFormat(left_size, left_data);
		right.ToUnifiedFormat(right_size, right_data);

		auto ldata = UnifiedVectorFormat::GetData<T>(left_data);
		auto rdata = UnifiedVectorFormat::GetData<T>(right_data);
		idx_t result_count = 0;
		for (; rpos < right_size; rpos++) {
			idx_t right_position = right_data.sel->get_index(rpos);
			bool right_is_valid = right_data.validity.RowIsValid(right_position);
			for (; lpos < left_size; lpos++) {
				if (result_count == STANDARD_VECTOR_SIZE) {
					// out of space!
					return result_count;
				}
				idx_t left_position = left_data.sel->get_index(lpos);
				bool left_is_valid = left_data.validity.RowIsValid(left_position);
				if (MATCH_OP::Operation(ldata[left_position], rdata[right_position], !left_is_valid, !right_is_valid)) {
					// emit tuple
					lvector.set_index(result_count, lpos);
					rvector.set_index(result_count, rpos);
					result_count++;
				}
			}
			lpos = 0;
		}
		return result_count;
	}